

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O2

int Abc_SclObjCheckMarkedFanFans(Abc_Obj_t *pObj)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((pObj->field_0x14 & 0x20) == 0) {
    uVar2 = (pObj->vFanins).nSize;
    uVar4 = 0;
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar3 = uVar4;
    }
    do {
      if (uVar3 == uVar4) {
        uVar2 = (pObj->vFanouts).nSize;
        uVar4 = 0;
        uVar3 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar3 = uVar4;
        }
        do {
          if (uVar3 == uVar4) {
            return 0;
          }
          piVar1 = (pObj->vFanouts).pArray + uVar4;
          uVar4 = uVar4 + 1;
        } while ((*(byte *)((long)pObj->pNtk->vObjs->pArray[*piVar1] + 0x14) & 0x20) == 0);
        return 1;
      }
      piVar1 = (pObj->vFanins).pArray + uVar4;
      uVar4 = uVar4 + 1;
    } while ((*(byte *)((long)pObj->pNtk->vObjs->pArray[*piVar1] + 0x14) & 0x20) == 0);
  }
  return 1;
}

Assistant:

int Abc_SclObjCheckMarkedFanFans( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pNext;
    int i;
    if ( pObj->fMarkB )
        return 1;
    Abc_ObjForEachFanin( pObj, pNext, i )
        if ( pNext->fMarkB )
            return 1;
    Abc_ObjForEachFanout( pObj, pNext, i )
        if ( pNext->fMarkB )
            return 1;
    return 0;
}